

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int checkload(lua_State *L,int stat,char *filename)

{
  char *pcVar1;
  char *pcVar2;
  char *filename_local;
  int stat_local;
  lua_State *L_local;
  
  if (stat == 0) {
    pcVar1 = lua_tolstring(L,1,(size_t *)0x0);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    L_local._4_4_ =
         luaL_error(L,"error loading module \'%s\' from file \'%s\':\n\t%s",pcVar1,filename,pcVar2);
  }
  else {
    lua_pushstring(L,filename);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int checkload (lua_State *L, int stat, const char *filename) {
  if (l_likely(stat)) {  /* module loaded successfully? */
    lua_pushstring(L, filename);  /* will be 2nd argument to module */
    return 2;  /* return open function and file name */
  }
  else
    return luaL_error(L, "error loading module '%s' from file '%s':\n\t%s",
                          lua_tostring(L, 1), filename, lua_tostring(L, -1));
}